

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void ar_summary(ar_object obj)

{
  int local_14;
  int i;
  ar_object obj_local;
  
  printf("\n\n");
  printf(" AR Order : ( %d) \n",(ulong)(uint)obj->p);
  printf("\n");
  printf("%-20s%-20s \n\n","Coefficients","Value");
  for (local_14 = 0; local_14 < obj->p; local_14 = local_14 + 1) {
    printf("AR%-15d%-20g \n",obj->phi[local_14],(ulong)(local_14 + 1));
  }
  printf("\n");
  printf("%-17s%-20g \n",obj->mean,"MEAN");
  printf("\n");
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  printf("\n");
  printf("ESTIMATION METHOD : ");
  if (obj->method == 0) {
    printf("Yule Walker");
  }
  else if (obj->method == 1) {
    printf("Burg");
  }
  else if (obj->method == 2) {
    printf("MLE");
  }
  printf("\n\n");
  return;
}

Assistant:

void ar_summary(ar_object obj) {
	int i;

	printf("\n\n");
	printf(" AR Order : ( %d) \n", obj->p);
	printf("\n");
	printf("%-20s%-20s \n\n", "Coefficients", "Value");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g \n", i + 1, obj->phi[i]);
	}
	printf("\n");
	
	printf("%-17s%-20g \n", "MEAN", obj->mean);
	
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("Yule Walker");
	}
	else if (obj->method == 1) {
		printf("Burg");
	}
	else if (obj->method == 2) {
		printf("MLE");
	}
	printf("\n\n");
}